

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase812::run(TestCase812 *this)

{
  StructDataBitCount *this_00;
  Builder builder_00;
  Builder builder_01;
  Reader reader;
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined8 in_stack_fffffffffffffde0;
  undefined5 in_stack_fffffffffffffde8;
  BuilderFor<capnproto_test::capnp::test::TestAllTypes> local_208;
  ReaderFor<capnproto_test::capnp::test::TestAllTypes> local_1e0;
  bool local_1ab;
  bool local_1aa;
  bool local_1a9;
  undefined1 local_1a8 [5];
  bool _kj_shouldLog_2;
  bool _kj_shouldLog_1;
  bool _kj_shouldLog;
  Orphan<capnproto_test::capnp::test::TestAllTypes> orphan;
  undefined1 auStack_160 [8];
  Builder child;
  undefined1 local_128 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase812 *this_local;
  
  this_00 = &root._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder((MallocMessageBuilder *)this_00,0,FIXED_SIZE);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)local_128,(MessageBuilder *)this_00);
  capnproto_test::capnp::test::TestAllTypes::Builder::initStructField
            ((Builder *)auStack_160,(Builder *)local_128);
  orphan.builder.location = (word *)auStack_160;
  builder_00._builder.capTable = child._builder.capTable;
  builder_00._builder.segment = child._builder.segment;
  builder_00._builder.data = child._builder.data;
  builder_00._builder.pointers = child._builder.pointers;
  builder_00._builder.dataSize = (int)in_stack_fffffffffffffde0;
  builder_00._builder.pointerCount = (short)((ulong)in_stack_fffffffffffffde0 >> 0x20);
  builder_00._builder._38_2_ = (short)((ulong)in_stack_fffffffffffffde0 >> 0x30);
  initTestMessage(builder_00);
  capnproto_test::capnp::test::TestAllTypes::Builder::disownStructField
            ((Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_1a8,(Builder *)local_128);
  uVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasStructField((Builder *)local_128);
  if ((bool)uVar1) {
    local_1a9 = kj::_::Debug::shouldLog(ERROR);
    while (local_1a9 != false) {
      kj::_::Debug::log<char_const(&)[42]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x333,ERROR,"\"failed: expected \" \"!(root.hasStructField())\"",
                 (char (*) [42])"failed: expected !(root.hasStructField())");
      local_1a9 = false;
    }
  }
  uVar2 = Orphan<capnproto_test::capnp::test::TestAllTypes>::operator!=
                    ((Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_1a8,(void *)0x0);
  if (!(bool)uVar2) {
    local_1aa = kj::_::Debug::shouldLog(ERROR);
    while (local_1aa != false) {
      kj::_::Debug::log<char_const(&)[35]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x334,ERROR,"\"failed: expected \" \"orphan != nullptr\"",
                 (char (*) [35])"failed: expected orphan != nullptr");
      local_1aa = false;
    }
  }
  uVar3 = Orphan<capnproto_test::capnp::test::TestAllTypes>::operator==
                    ((Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_1a8,(void *)0x0);
  if ((bool)uVar3) {
    local_1ab = kj::_::Debug::shouldLog(ERROR);
    while (local_1ab != false) {
      kj::_::Debug::log<char_const(&)[38]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x335,ERROR,"\"failed: expected \" \"!(orphan == nullptr)\"",
                 (char (*) [38])"failed: expected !(orphan == nullptr)");
      local_1ab = false;
    }
  }
  Orphan<capnproto_test::capnp::test::TestAllTypes>::getReader
            (&local_1e0,(Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_1a8);
  reader._reader.capTable = (CapTableReader *)local_1e0._reader.data;
  reader._reader.segment = (SegmentReader *)local_1e0._reader.capTable;
  reader._reader.data = local_1e0._reader.pointers;
  reader._reader.pointers = (WirePointer *)local_1e0._reader._32_8_;
  reader._reader.dataSize = local_1e0._reader.nestingLimit;
  reader._reader.pointerCount = local_1e0._reader._44_2_;
  reader._reader._38_2_ = local_1e0._reader._46_2_;
  reader._reader._40_5_ = in_stack_fffffffffffffde8;
  reader._reader._45_1_ = uVar3;
  reader._reader._46_1_ = uVar2;
  reader._reader._47_1_ = uVar1;
  checkTestMessage(reader);
  Orphan<capnproto_test::capnp::test::TestAllTypes>::get
            (&local_208,(Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_1a8);
  builder_01._builder.capTable = (CapTableBuilder *)local_208._builder.data;
  builder_01._builder.segment = (SegmentBuilder *)local_208._builder.capTable;
  builder_01._builder.data = local_208._builder.pointers;
  builder_01._builder.pointers = (WirePointer *)local_208._builder._32_8_;
  builder_01._builder.dataSize = local_1e0._reader.nestingLimit;
  builder_01._builder.pointerCount = local_1e0._reader._44_2_;
  builder_01._builder._38_2_ = local_1e0._reader._46_2_;
  checkTestMessage(builder_01);
  Orphan<capnproto_test::capnp::test::TestAllTypes>::~Orphan
            ((Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_1a8);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
  return;
}

Assistant:

TEST(Orphans, FarPointer) {
  MallocMessageBuilder builder(0, AllocationStrategy::FIXED_SIZE);
  auto root = builder.initRoot<TestAllTypes>();
  auto child = root.initStructField();
  initTestMessage(child);

  auto orphan = root.disownStructField();
  EXPECT_FALSE(root.hasStructField());
  EXPECT_TRUE(orphan != nullptr);
  EXPECT_FALSE(orphan == nullptr);

  checkTestMessage(orphan.getReader());
  checkTestMessage(orphan.get());
}